

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O2

uint ** gf_matr_inv(uint **a,uint a_rows,uint a_cols)

{
  uint *puVar1;
  uint b;
  uint uVar2;
  uint **a_00;
  uint **ppuVar3;
  ulong uVar4;
  ulong extraout_RDX;
  ulong uVar5;
  uint j;
  ulong uVar6;
  
  if (a_rows == 2 || a_rows == a_cols) {
    b = gf_matr_det(a,a_rows,a_cols);
    a_00 = matrix_copy(a,a_rows,a_cols);
    ppuVar3 = matrix_new(a_rows,a_cols);
    puVar1 = a_00[1];
    uVar2 = **a_00;
    uVar4 = (ulong)uVar2;
    **a_00 = puVar1[1];
    puVar1[1] = uVar2;
    for (uVar5 = 0; uVar5 != a_rows; uVar5 = uVar5 + 1) {
      for (uVar6 = 0; a_cols != uVar6; uVar6 = uVar6 + 1) {
        uVar2 = gf_div(a_00[uVar5][uVar6],b);
        ppuVar3[uVar5][uVar6] = uVar2;
        uVar4 = extraout_RDX;
      }
    }
    matrix_free(a_00,a_rows,(uint)uVar4);
    return ppuVar3;
  }
  fatal((uchar *)"gf_matr_inv",(uchar *)"Ainv only for 2x2 matrices\n");
}

Assistant:

uint32_t **gf_matr_inv(uint32_t **a, uint32_t a_rows, uint32_t a_cols)
{
    if (a_rows != a_cols && a_rows != 2)
        fatal("gf_matr_inv", "Ainv only for 2x2 matrices\n");

    uint32_t det = gf_matr_det(a, a_rows, a_cols);

    uint32_t **a0 = matrix_copy(a, a_rows, a_cols);
    uint32_t **a0inv = matrix_new(a_rows, a_cols);

    swap(&a0[0][0], &a0[1][1]);

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            a0inv[i][j] = gf_div(a0[i][j], det);

    matrix_free(a0, a_rows, a_cols);

    return a0inv;
}